

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O1

vector_brodnik<unsigned_char_*> * __thiscall
TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_>::get_bucket
          (TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *this,uint index)

{
  pointer ppvVar1;
  vector_brodnik<unsigned_char_*> *pvVar2;
  ulong uVar3;
  
  uVar3 = (ulong)index;
  ppvVar1 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppvVar1 >> 3)) {
    pvVar2 = (vector_brodnik<unsigned_char_*> *)ppvVar1[uVar3];
    if (pvVar2 != (vector_brodnik<unsigned_char_*> *)0x0) {
      return pvVar2;
    }
  }
  else {
    std::vector<void_*,_std::allocator<void_*>_>::resize(&this->_buckets,(ulong)(index + 1));
  }
  pvVar2 = (vector_brodnik<unsigned_char_*> *)operator_new(0x38);
  (pvVar2->_index_block).super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->_index_block).super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar2->_index_block).super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vector_brodnik<unsigned_char_*>::clear(pvVar2);
  (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start[uVar3] = pvVar2;
  return pvVar2;
}

Assistant:

BucketT* get_bucket(unsigned index)
	{
		if (index < _buckets.size()) {
			BucketT* b = static_cast<BucketT*>(_buckets[index]);
			if (not b) { _buckets[index] = b = new BucketT; }
			return b;
		} else {
			_buckets.resize(index+1);
			BucketT* b = new BucketT;
			_buckets[index] = b;
			return b;
		}
	}